

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book.cc
# Opt level: O1

uint64_t __thiscall helix::order_book::midprice(order_book *this,size_t level)

{
  _Self __tmp;
  _Rb_tree_node_base *p_Var1;
  _Base_ptr p_Var2;
  size_t sVar3;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  
  p_Var1 = (this->_bids)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->_bids)._M_t._M_impl.super__Rb_tree_header;
  bVar6 = (_Rb_tree_header *)p_Var1 == p_Var4;
  if (!bVar6) {
    if (level != 0) {
      p_Var2 = (_Base_ptr)0x0;
      sVar3 = level;
      do {
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
        bVar6 = (_Rb_tree_header *)p_Var1 == p_Var4;
        if (bVar6) goto LAB_00112312;
        sVar3 = sVar3 - 1;
      } while (sVar3 != 0);
    }
    if (!bVar6) {
      p_Var2 = p_Var1[1]._M_parent;
      goto LAB_00112312;
    }
  }
  p_Var2 = (_Base_ptr)0x0;
LAB_00112312:
  p_Var1 = (this->_asks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->_asks)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (_Base_ptr)0xffffffffffffffff;
  bVar6 = (_Rb_tree_header *)p_Var1 == p_Var4;
  if (!bVar6) {
    if (level != 0) {
      do {
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
        bVar6 = (_Rb_tree_header *)p_Var1 == p_Var4;
        if (bVar6) goto LAB_00112351;
        level = level - 1;
      } while (level != 0);
    }
    if (!bVar6) {
      p_Var5 = p_Var1[1]._M_parent;
    }
  }
LAB_00112351:
  return (ulong)((long)&p_Var2->_M_color + (long)&p_Var5->_M_color) >> 1;
}

Assistant:

uint64_t order_book::midprice(size_t level) const
{
    auto bid = bid_price(level);
    auto ask = ask_price(level);
    return (bid + ask) / 2;
}